

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O0

float webrtc::Distance<float>(CartesianPoint<float> a,CartesianPoint<float> b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  undefined1 local_34 [8];
  CartesianPoint<float> b_local;
  undefined1 local_18 [8];
  CartesianPoint<float> a_local;
  
  b_local.c[0] = b.c[2];
  local_34 = b.c._0_8_;
  a_local.c[0] = a.c[2];
  b_local.c._4_8_ = a.c._0_8_;
  local_18 = (undefined1  [8])b_local.c._4_8_;
  fVar1 = CartesianPoint<float>::x((CartesianPoint<float> *)local_18);
  fVar2 = CartesianPoint<float>::x((CartesianPoint<float> *)local_34);
  fVar3 = CartesianPoint<float>::x((CartesianPoint<float> *)local_18);
  fVar4 = CartesianPoint<float>::x((CartesianPoint<float> *)local_34);
  fVar5 = CartesianPoint<float>::y((CartesianPoint<float> *)local_18);
  fVar6 = CartesianPoint<float>::y((CartesianPoint<float> *)local_34);
  fVar7 = CartesianPoint<float>::y((CartesianPoint<float> *)local_18);
  fVar8 = CartesianPoint<float>::y((CartesianPoint<float> *)local_34);
  fVar9 = CartesianPoint<float>::z((CartesianPoint<float> *)local_18);
  fVar10 = CartesianPoint<float>::z((CartesianPoint<float> *)local_34);
  fVar11 = CartesianPoint<float>::z((CartesianPoint<float> *)local_18);
  fVar12 = CartesianPoint<float>::z((CartesianPoint<float> *)local_34);
  dVar13 = std::sqrt((double)(ulong)(uint)((fVar9 - fVar10) * (fVar11 - fVar12) +
                                          (fVar1 - fVar2) * (fVar3 - fVar4) +
                                          (fVar5 - fVar6) * (fVar7 - fVar8)));
  return SUB84(dVar13,0);
}

Assistant:

float Distance(CartesianPoint<T> a, CartesianPoint<T> b) {
  return std::sqrt((a.x() - b.x()) * (a.x() - b.x()) +
                   (a.y() - b.y()) * (a.y() - b.y()) +
                   (a.z() - b.z()) * (a.z() - b.z()));
}